

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int imm_move_p(MIR_insn_t insn)

{
  int iVar1;
  bool local_12;
  bool local_11;
  MIR_insn_t insn_local;
  
  iVar1 = move_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
  local_11 = false;
  if (((iVar1 != 0) && (local_11 = false, (*(ushort *)&insn->ops[0].field_0x8 & 0xff) == 2)) &&
     (local_11 = false, 0x21 < insn->ops[0].u.reg)) {
    local_12 = true;
    if (((((ulong)insn[1].insn_link.prev & 0xff) != 3) &&
        (local_12 = true, ((ulong)insn[1].insn_link.prev & 0xff) != 4)) &&
       ((local_12 = true, ((ulong)insn[1].insn_link.prev & 0xff) != 5 &&
        ((local_12 = true, ((ulong)insn[1].insn_link.prev & 0xff) != 6 &&
         (local_12 = true, ((ulong)insn[1].insn_link.prev & 0xff) != 7)))))) {
      local_12 = ((ulong)insn[1].insn_link.prev & 0xff) == 8;
    }
    local_11 = local_12;
  }
  return (int)local_11;
}

Assistant:

static int imm_move_p (MIR_insn_t insn) {
  return (move_code_p (insn->code) && insn->ops[0].mode == MIR_OP_VAR
          && insn->ops[0].u.var > MAX_HARD_REG
          && (insn->ops[1].mode == MIR_OP_INT || insn->ops[1].mode == MIR_OP_UINT
              || insn->ops[1].mode == MIR_OP_FLOAT || insn->ops[1].mode == MIR_OP_DOUBLE
              || insn->ops[1].mode == MIR_OP_LDOUBLE || insn->ops[1].mode == MIR_OP_REF));
}